

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O1

void duckdb::TryTransformStarLike
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *root)

{
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this;
  pointer pcVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Alloc_hider _Var3;
  int iVar4;
  pointer pPVar5;
  BaseExpression *pBVar6;
  FunctionExpression *pFVar7;
  reference pvVar8;
  const_iterator cVar9;
  reference this_00;
  ColumnRefExpression *this_01;
  pointer pCVar10;
  LambdaExpression *this_02;
  StarExpression *pSVar11;
  pointer pSVar12;
  BinderException *pBVar13;
  type pPVar14;
  long lVar15;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var16;
  templated_unique_single_t columns_expr;
  templated_unique_single_t lhs;
  type star_expr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  filter_children;
  string original_alias;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supported_ops;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_230;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_228;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_220;
  StarExpression *local_218;
  FunctionExpression *local_210;
  string local_208;
  char *local_1e8 [2];
  char local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(root);
  if ((pPVar5->super_BaseExpression).expression_class == FUNCTION) {
    pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(root)->super_BaseExpression;
    pFVar7 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar6);
    if (((long)(pFVar7->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pFVar7->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start & 0xfffffffffffffff0U) == 0x10) {
      this = &pFVar7->children;
      pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
               ::operator[](this,0);
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar8);
      if ((pPVar5->super_BaseExpression).expression_class == STAR) {
        pBVar6 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(pvVar8)->super_BaseExpression;
        local_218 = BaseExpression::Cast<duckdb::StarExpression>(pBVar6);
        if (local_218->columns == false) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"~~","");
          local_1e8[0] = local_1d8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"!~~","");
          local_1c8[0] = local_1b8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"~~~","");
          local_1a8[0] = local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"!~~~","");
          local_188[0] = local_178;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"~~*","");
          local_168[0] = local_158;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"!~~*","");
          local_148[0] = local_138;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_148,"regexp_full_match","");
          local_128[0] = local_118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_128,"not_like_escape","");
          local_108[0] = local_f8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"ilike_escape","");
          local_e8[0] = local_d8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e8,"not_ilike_escape","");
          local_c8[0] = local_b8;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"like_escape","");
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::_Hashtable<std::__cxx11::string_const*>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)&local_68,&local_208,local_a8,0,local_a8,&local_230,&local_220);
          lVar15 = 0;
          local_210 = pFVar7;
          do {
            if (local_b8 + lVar15 != *(undefined1 **)((long)local_c8 + lVar15)) {
              operator_delete(*(undefined1 **)((long)local_c8 + lVar15));
            }
            lVar15 = lVar15 + -0x20;
          } while (lVar15 != -0x160);
          cVar9 = ::std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&local_68,&pFVar7->function_name);
          pSVar11 = local_218;
          if (cVar9.
              super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(root);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,"Function \"%s\" cannot be applied to a star expression"
                       ,"");
            local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
            pcVar1 = (local_210->function_name)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar1,
                       pcVar1 + (local_210->function_name)._M_string_length);
            BinderException::BinderException<std::__cxx11::string>
                      (pBVar13,pPVar14,&local_208,&local_88);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          this_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this,1);
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(this_00);
          if ((pPVar5->super_BaseExpression).expression_class != CONSTANT) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(root);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,
                       "Pattern applied to a star expression must be a constant","");
            BinderException::BinderException<>(pBVar13,pPVar14,&local_208);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((pSVar11->rename_list)._M_h._M_element_count != 0) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(root);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,
                       "Rename list cannot be combined with a filtering operation","");
            BinderException::BinderException<>(pBVar13,pPVar14,&local_208);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((pSVar11->replace_list)._M_h._M_element_count != 0) {
            pBVar13 = (BinderException *)__cxa_allocate_exception(0x10);
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(root);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,
                       "Replace list cannot be combined with a filtering operation","");
            BinderException::BinderException<>(pBVar13,pPVar14,&local_208);
            __cxa_throw(pBVar13,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(root);
          pcVar1 = (pPVar5->super_BaseExpression).alias._M_dataplus._M_p;
          local_a8[0] = local_98;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a8,pcVar1,
                     pcVar1 + (pPVar5->super_BaseExpression).alias._M_string_length);
          local_220._M_head_impl =
               (pvVar8->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pvVar8->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          iVar4 = ::std::__cxx11::string::compare((char *)&pFVar7->function_name);
          if ((iVar4 == 0) && ((local_218->exclude_list)._M_h._M_element_count == 0)) {
            _Var16._M_head_impl =
                 (this_00->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (this_00->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
          }
          else {
            this_01 = (ColumnRefExpression *)operator_new(0x50);
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_208,"__lambda_col","");
            ColumnRefExpression::ColumnRefExpression(this_01,&local_208);
            local_228._M_head_impl = this_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
            pCVar10 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                                    *)&local_228);
            (*(pCVar10->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[0xc])
                      (&local_208);
            pvVar8 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     ::operator[](this,0);
            _Var3._M_p = local_208._M_dataplus._M_p;
            local_208._M_dataplus._M_p = (pointer)0x0;
            _Var16._M_head_impl =
                 (pvVar8->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pvVar8->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)_Var3._M_p;
            if (_Var16._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var16._M_head_impl)->super_BaseExpression + 8))();
            }
            if ((long *)local_208._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_208._M_dataplus._M_p + 8))();
            }
            this_02 = (LambdaExpression *)operator_new(0x50);
            local_208._M_dataplus._M_p = (pointer)local_228._M_head_impl;
            local_228._M_head_impl = (ColumnRefExpression *)0x0;
            local_230._M_head_impl =
                 (root->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (root->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
            LambdaExpression::LambdaExpression
                      (this_02,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)&local_208,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_230);
            if (local_230._M_head_impl != (ParsedExpression *)0x0) {
              (*((local_230._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            local_230._M_head_impl = (ParsedExpression *)0x0;
            if ((ColumnRefExpression *)local_208._M_dataplus._M_p != (ColumnRefExpression *)0x0) {
              (**(code **)(*(long *)local_208._M_dataplus._M_p + 8))();
            }
            local_208._M_dataplus._M_p = (pointer)0x0;
            local_208._M_string_length = 0;
            local_208.field_2._M_allocated_capacity = 0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&local_208,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_220);
            local_230._M_head_impl = (ParsedExpression *)this_02;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&local_208,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&local_230);
            if ((LambdaExpression *)local_230._M_head_impl != (LambdaExpression *)0x0) {
              (*((local_230._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            }
            make_uniq<duckdb::FunctionExpression,char_const(&)[12],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                      ((duckdb *)&local_230,(char (*) [12])"list_filter",
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)&local_208);
            _Var16._M_head_impl = local_230._M_head_impl;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)&local_208);
            if (local_228._M_head_impl != (ColumnRefExpression *)0x0) {
              (*((local_228._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression[1])();
            }
          }
          pSVar11 = (StarExpression *)operator_new(0x110);
          local_208._M_string_length = 0;
          local_208.field_2._M_allocated_capacity =
               local_208.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          StarExpression::StarExpression(pSVar11,&local_208);
          local_230._M_head_impl = (ParsedExpression *)pSVar11;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          pSVar12 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                    ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                                  *)&local_230);
          pSVar12->columns = true;
          pSVar12 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                    ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                                  *)&local_230);
          _Var2._M_head_impl =
               (pSVar12->expr).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (pSVar12->expr).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               _Var16._M_head_impl;
          if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
          }
          pSVar12 = unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                    ::operator->((unique_ptr<duckdb::StarExpression,_std::default_delete<duckdb::StarExpression>,_true>
                                  *)&local_230);
          ::std::__cxx11::string::operator=
                    ((string *)&(pSVar12->super_ParsedExpression).super_BaseExpression.alias,
                     (string *)local_a8);
          _Var2._M_head_impl = local_230._M_head_impl;
          local_230._M_head_impl = (ParsedExpression *)0x0;
          _Var16._M_head_impl =
               (root->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          (root->
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               _Var2._M_head_impl;
          if (_Var16._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var16._M_head_impl)->super_BaseExpression + 8))();
          }
          if (local_230._M_head_impl != (ParsedExpression *)0x0) {
            (*((local_230._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          if (local_220._M_head_impl != (ParsedExpression *)0x0) {
            (*((local_220._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          if (local_a8[0] != local_98) {
            operator_delete(local_a8[0]);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)&local_68);
        }
      }
    }
  }
  return;
}

Assistant:

void TryTransformStarLike(unique_ptr<ParsedExpression> &root) {
	// detect "* LIKE [literal]" and similar expressions
	if (root->GetExpressionClass() != ExpressionClass::FUNCTION) {
		return;
	}
	auto &function = root->Cast<FunctionExpression>();
	if (function.children.size() < 2 || function.children.size() > 3) {
		return;
	}
	auto &left = function.children[0];
	// expression must have a star on the LHS, and a literal on the RHS
	if (left->GetExpressionClass() != ExpressionClass::STAR) {
		return;
	}
	auto &star = left->Cast<StarExpression>();
	if (star.columns) {
		// COLUMNS(*) has different semantics
		return;
	}
	unordered_set<string> supported_ops {"~~",
	                                     "!~~",
	                                     "~~~",
	                                     "!~~~",
	                                     "~~*",
	                                     "!~~*",
	                                     "regexp_full_match",
	                                     "not_like_escape",
	                                     "ilike_escape",
	                                     "not_ilike_escape",
	                                     "like_escape"};
	if (supported_ops.count(function.function_name) == 0) {
		// unsupported op for * expression
		throw BinderException(*root, "Function \"%s\" cannot be applied to a star expression", function.function_name);
	}
	auto &right = function.children[1];
	if (right->GetExpressionClass() != ExpressionClass::CONSTANT) {
		throw BinderException(*root, "Pattern applied to a star expression must be a constant");
	}
	if (!star.rename_list.empty()) {
		throw BinderException(*root, "Rename list cannot be combined with a filtering operation");
	}
	if (!star.replace_list.empty()) {
		throw BinderException(*root, "Replace list cannot be combined with a filtering operation");
	}
	auto original_alias = root->GetAlias();
	auto star_expr = std::move(left);
	unique_ptr<ParsedExpression> child_expr;
	if (function.function_name == "regexp_full_match" && star.exclude_list.empty()) {
		// * SIMILAR TO '[regex]' is equivalent to COLUMNS('[regex]') so we can just move the expression directly
		child_expr = std::move(right);
	} else {
		// for other expressions -> generate a columns expression
		// "* LIKE '%literal%'
		// -> COLUMNS(list_filter(*, x -> x LIKE '%literal%'))
		auto lhs = make_uniq<ColumnRefExpression>("__lambda_col");
		function.children[0] = lhs->Copy();

		auto lambda = make_uniq<LambdaExpression>(std::move(lhs), std::move(root));
		vector<unique_ptr<ParsedExpression>> filter_children;
		filter_children.push_back(std::move(star_expr));
		filter_children.push_back(std::move(lambda));
		auto list_filter = make_uniq<FunctionExpression>("list_filter", std::move(filter_children));
		child_expr = std::move(list_filter);
	}

	auto columns_expr = make_uniq<StarExpression>();
	columns_expr->columns = true;
	columns_expr->expr = std::move(child_expr);
	columns_expr->SetAlias(std::move(original_alias));
	root = std::move(columns_expr);
}